

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

bool libaom_examples::anon_unknown_0::validate_layer
               (LayerMetadata *layer,bool layer_has_alpha,bool layer_has_depth)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  char *__format;
  uint uVar3;
  undefined8 uStack_8;
  
  bVar1 = 1 < (int)layer->layer_metadata_scope;
  uVar3 = 0;
  if (layer->layer_type == MULTILAYER_LAYER_TYPE_ALPHA) {
    uVar3 = (uint)bVar1;
  }
  if (uVar3 == (uint)CONCAT71(in_register_00000031,layer_has_alpha)) {
    if ((layer->layer_type == MULTILAYER_LAYER_TYPE_DEPTH && bVar1) == layer_has_depth) {
      return bVar1;
    }
    __format = 
    "Error: depth info must be set if and only if layer_type is %d and layer_metadata_scpoe is >= %d\n"
    ;
    uStack_8 = 6;
  }
  else {
    __format = 
    "Error: alpha info must be set if and only if layer_type is %d and layer_metadata_scpoe is >= %d\n"
    ;
    uStack_8 = 5;
  }
  iVar2 = fprintf(_stderr,__format,uStack_8,2);
  return SUB41(iVar2,0);
}

Assistant:

bool validate_layer(const LayerMetadata &layer, bool layer_has_alpha,
                    bool layer_has_depth) {
  if (layer_has_alpha != (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: alpha info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_ALPHA, SCOPE_GLOBAL);
    return false;
  }
  if (layer_has_depth != (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: depth info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_DEPTH, SCOPE_GLOBAL);
    return false;
  }
  return true;
}